

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

void __thiscall Kvm::printCell(Kvm *this,Value *v,ostream *out)

{
  Value *pVVar1;
  
  while( true ) {
    print(this,(Value *)v[1]._vptr_Value,out);
    pVVar1 = *(Value **)&v[1].type_;
    if ((((ulong)pVVar1 & 3) != 0) || (pVVar1->type_ != CELL)) break;
    std::operator<<(out," ");
    v = *(Value **)&v[1].type_;
  }
  if (pVVar1 != this->NIL) {
    std::operator<<(out," . ");
    print(this,*(Value **)&v[1].type_,out);
    return;
  }
  return;
}

Assistant:

void Kvm::printCell(const Value *v, std::ostream &out)
{
    print(car(v), out);
    if (isCell(cdr(v)))
    {
        out << " ";
        printCell(cdr(v), out);
    } else if (cdr(v) != NIL)
    {
        out << " . ";
        print(cdr(v), out);
    }
}